

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string_view __thiscall
google::protobuf::FieldDescriptor::PrintableNameForExtension(FieldDescriptor *this)

{
  byte bVar1;
  Descriptor *pDVar2;
  Descriptor *pDVar3;
  Nonnull<const_char_*> pcVar4;
  bool v1;
  DescriptorNames *pDVar5;
  string_view sVar6;
  
  bVar1 = this->field_0x1;
  if (((((bVar1 & 8) != 0) &&
       ((this->containing_type_->options_->field_0)._impl_.message_set_wire_format_ == true)) &&
      (this->type_ == '\v')) && ((this->merged_features_->field_0)._impl_.field_presence_ != 3)) {
    v1 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == v1) {
      pcVar4 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (v1,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar4 != (Nonnull<const_char_*>)0x0) {
LAB_00229707:
      PrintableNameForExtension();
    }
    if ((this->field_0x1 & 0x20) == 0) {
      if ((this->field_0x1 & 8) == 0) {
        PrintableNameForExtension();
        goto LAB_00229707;
      }
      pDVar3 = (Descriptor *)(this->scope_).containing_oneof;
      pDVar2 = message_type(this);
      if (pDVar3 == pDVar2) {
        pDVar3 = message_type(this);
        pDVar5 = &pDVar3->all_names_;
        goto LAB_00229669;
      }
    }
  }
  pDVar5 = &this->all_names_;
LAB_00229669:
  sVar6._M_len = (ulong)*(ushort *)(pDVar5->payload_ + 2);
  sVar6._M_str = pDVar5->payload_ + ~sVar6._M_len;
  return sVar6;
}

Assistant:

absl::string_view FieldDescriptor::PrintableNameForExtension() const {
  const bool is_message_set_extension =
      is_extension() &&
      containing_type()->options().message_set_wire_format() &&
      type() == FieldDescriptor::TYPE_MESSAGE && !is_required() &&
      !is_repeated() && extension_scope() == message_type();
  return is_message_set_extension ? message_type()->full_name() : full_name();
}